

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_delim_join.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::PlanDelimJoin(PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  LogicalType *__x;
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *this_00;
  pointer puVar1;
  ClientContext *args;
  PhysicalOperator *args_2;
  reference pvVar2;
  pointer this_01;
  BoundReferenceExpression *pBVar3;
  tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this_02;
  reference pvVar4;
  pointer pPVar5;
  PhysicalOperator *pPVar6;
  idx_t delim_index;
  pointer this_03;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_d0;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> delim_scans;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  distinct_groups;
  vector<duckdb::LogicalType,_true> delim_types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  distinct_expressions;
  LogicalType local_48;
  
  args_2 = PlanComparisonJoin(this,op);
  delim_scans.
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delim_scans.
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  delim_scans.
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&args_2->children,(ulong)op->delim_flipped ^ 1);
  pPVar6 = pvVar2->_M_data;
  delim_index = this->delim_index + 1;
  this->delim_index = delim_index;
  GatherDelimScans(pPVar6,&delim_scans,delim_index);
  if (delim_scans.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      delim_scans.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    delim_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    delim_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    delim_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_groups.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_groups.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    distinct_groups.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    distinct_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    distinct_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_03 = (op->duplicate_eliminated_columns).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (op->duplicate_eliminated_columns).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_03 != puVar1) {
      do {
        this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_03);
        pBVar3 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                           (&this_01->super_BaseExpression);
        __x = &(pBVar3->super_Expression).return_type;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&delim_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
        this_02.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
             operator_new(0x60);
        LogicalType::LogicalType(&local_48,__x);
        BoundReferenceExpression::BoundReferenceExpression
                  ((BoundReferenceExpression *)
                   this_02.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,&local_48,
                   pBVar3->index);
        LogicalType::~LogicalType(&local_48);
        local_d0._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
             (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
             this_02.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&distinct_groups,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_d0);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_d0._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)local_d0._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8
                      ))();
        }
        this_03 = this_03 + 1;
      } while (this_03 != puVar1);
    }
    args = this->context;
    pvVar4 = vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>::operator[]
                       (&delim_scans,0);
    pPVar6 = pvVar4->_M_data;
    this_00 = &this->physical_plan;
    pPVar5 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(this_00);
    pPVar6 = PhysicalPlan::
             Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long_const&>
                       (pPVar5,args,&delim_types,&distinct_expressions,&distinct_groups,
                        &pPVar6->estimated_cardinality);
    if (op->delim_flipped == true) {
      optional_idx::optional_idx((optional_idx *)&local_48,this->delim_index);
      pPVar5 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
               operator->(this_00);
      args_2 = PhysicalPlan::
               Make<duckdb::PhysicalRightDelimJoin,duckdb::PhysicalPlanGenerator&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,true>&,unsigned_long&,duckdb::optional_idx>
                         (pPVar5,this,&(op->super_LogicalJoin).super_LogicalOperator.types,args_2,
                          pPVar6,&delim_scans,
                          &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality,
                          (optional_idx *)&local_48);
    }
    else {
      optional_idx::optional_idx((optional_idx *)&local_48,this->delim_index);
      pPVar5 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
               operator->(this_00);
      args_2 = PhysicalPlan::
               Make<duckdb::PhysicalLeftDelimJoin,duckdb::PhysicalPlanGenerator&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,true>&,unsigned_long&,duckdb::optional_idx>
                         (pPVar5,this,&(op->super_LogicalJoin).super_LogicalOperator.types,args_2,
                          pPVar6,&delim_scans,
                          &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality,
                          (optional_idx *)&local_48);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&distinct_expressions);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&distinct_groups);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&delim_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
    ;
  }
  if (delim_scans.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(delim_scans.
                    super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return args_2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::PlanDelimJoin(LogicalComparisonJoin &op) {
	// first create the underlying join
	auto &plan = PlanComparisonJoin(op);
	// this should create a join, not a cross product
	D_ASSERT(plan.type != PhysicalOperatorType::CROSS_PRODUCT);
	// duplicate eliminated join
	// first gather the scans on the duplicate eliminated data set from the delim side
	const idx_t delim_idx = op.delim_flipped ? 0 : 1;
	vector<const_reference<PhysicalOperator>> delim_scans;
	GatherDelimScans(plan.children[delim_idx], delim_scans, ++this->delim_index);
	if (delim_scans.empty()) {
		// no duplicate eliminated scans in the delim side!
		// in this case we don't need to create a delim join
		// just push the normal join
		return plan;
	}
	vector<LogicalType> delim_types;
	vector<unique_ptr<Expression>> distinct_groups, distinct_expressions;
	for (auto &delim_expr : op.duplicate_eliminated_columns) {
		D_ASSERT(delim_expr->GetExpressionType() == ExpressionType::BOUND_REF);
		auto &bound_ref = delim_expr->Cast<BoundReferenceExpression>();
		delim_types.push_back(bound_ref.return_type);
		distinct_groups.push_back(make_uniq<BoundReferenceExpression>(bound_ref.return_type, bound_ref.index));
	}

	// we still have to create the DISTINCT clause that is used to generate the duplicate eliminated chunk
	auto &distinct =
	    Make<PhysicalHashAggregate>(context, delim_types, std::move(distinct_expressions), std::move(distinct_groups),
	                                delim_scans[0].get().estimated_cardinality);

	// Create the duplicate eliminated join.
	if (op.delim_flipped) {
		return Make<PhysicalRightDelimJoin>(*this, op.types, plan, distinct, delim_scans, op.estimated_cardinality,
		                                    optional_idx(this->delim_index));
	}
	return Make<PhysicalLeftDelimJoin>(*this, op.types, plan, distinct, delim_scans, op.estimated_cardinality,
	                                   optional_idx(this->delim_index));
}